

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

string * reduce(string *__return_storage_ptr__,string *str,string *fill,string *whitespace)

{
  long lVar1;
  size_type newStart;
  size_type range;
  size_type endSpace;
  size_type beginSpace;
  string *whitespace_local;
  string *fill_local;
  string *str_local;
  string *result_local;
  
  trim(__return_storage_ptr__,str,whitespace);
  endSpace = std::__cxx11::string::find_first_of((string *)__return_storage_ptr__,(ulong)whitespace)
  ;
  while (endSpace != 0xffffffffffffffff) {
    lVar1 = std::__cxx11::string::find_first_not_of
                      ((string *)__return_storage_ptr__,(ulong)whitespace);
    std::__cxx11::string::replace
              ((ulong)__return_storage_ptr__,endSpace,(string *)(lVar1 - endSpace));
    std::__cxx11::string::length();
    endSpace = std::__cxx11::string::find_first_of
                         ((string *)__return_storage_ptr__,(ulong)whitespace);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string reduce(const std::string& str,
                   const std::string& fill,
                   const std::string& whitespace) {
  // trim first
  auto result_local = trim(str, whitespace);

  // replace sub ranges
  auto beginSpace = result_local.find_first_of(whitespace);
  while (beginSpace != std::string::npos) {
    const auto endSpace =
        result_local.find_first_not_of(whitespace, beginSpace);
    const auto range = endSpace - beginSpace;

    result_local.replace(beginSpace, range, fill);

    const auto newStart = beginSpace + fill.length();
    beginSpace = result_local.find_first_of(whitespace, newStart);
  }

  return result_local;
}